

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

OPJ_BOOL opj_dwt_encode_procedure
                   (opj_tcd_tilecomp_t *tilec,
                   _func_void_OPJ_INT32_ptr_OPJ_INT32_OPJ_INT32_OPJ_INT32 *p_function)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  OPJ_INT32 *pOVar8;
  OPJ_INT32 *ptr;
  OPJ_INT32 *pOVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  opj_tcd_resolution_t *poVar17;
  int iVar18;
  OPJ_BOOL OVar19;
  uint uVar20;
  OPJ_INT32 *pOVar21;
  uint uVar22;
  int iVar23;
  OPJ_INT32 *pOVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  
  OVar1 = tilec->numresolutions;
  OVar19 = 0;
  poVar17 = tilec->resolutions;
  uVar26 = 0;
  iVar18 = OVar1 - 1;
  if (iVar18 != 0) {
    pOVar8 = &poVar17[1].y1;
    uVar15 = 0;
    iVar11 = iVar18;
    do {
      uVar20 = pOVar8[-1] - ((opj_tcd_resolution_t *)(pOVar8 + -3))->x0;
      if (uVar20 < uVar15) {
        uVar20 = uVar15;
      }
      uVar15 = *pOVar8 - pOVar8[-2];
      if ((uint)(*pOVar8 - pOVar8[-2]) < uVar20) {
        uVar15 = uVar20;
      }
      uVar26 = (ulong)uVar15;
      pOVar8 = pOVar8 + 0x30;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  iVar11 = tilec->x1;
  iVar2 = tilec->x0;
  lVar25 = (long)iVar2;
  pOVar8 = tilec->data;
  ptr = (OPJ_INT32 *)opj_malloc(uVar26 << 2);
  if (ptr != (OPJ_INT32 *)0x0 || (int)uVar26 == 0) {
    if (iVar18 != 0) {
      poVar17 = poVar17 + iVar18;
      iVar18 = OVar1 - 2;
      do {
        iVar3 = poVar17->x1;
        uVar15 = poVar17->x0;
        iVar23 = poVar17->y1;
        uVar20 = poVar17->y0;
        uVar22 = iVar23 - uVar20;
        iVar4 = poVar17[-1].x1;
        iVar5 = poVar17[-1].x0;
        uVar12 = iVar3 - uVar15;
        if (uVar12 != 0 && (int)uVar15 <= iVar3) {
          iVar6 = poVar17[-1].y0;
          iVar7 = poVar17[-1].y1;
          iVar16 = iVar7 - iVar6;
          uVar26 = (ulong)((uVar20 & 1) * 4);
          pOVar21 = (OPJ_INT32 *)((long)iVar16 * (long)(iVar11 - iVar2) * 4 + (long)pOVar8);
          uVar10 = 0;
          pOVar24 = pOVar8;
          do {
            if (0 < (int)uVar22) {
              uVar13 = 0;
              pOVar9 = pOVar24;
              do {
                ptr[uVar13] = *pOVar9;
                uVar13 = uVar13 + 1;
                pOVar9 = pOVar9 + (iVar11 - lVar25);
              } while (uVar22 != uVar13);
            }
            (*p_function)(ptr,uVar22 - iVar16,iVar16,uVar20 & 1);
            if (iVar16 != 0) {
              lVar14 = 0;
              pOVar9 = pOVar24;
              do {
                *pOVar9 = *(OPJ_INT32 *)((long)ptr + lVar14 * 8 + uVar26);
                lVar14 = lVar14 + 1;
                pOVar9 = pOVar9 + (iVar11 - lVar25);
              } while (iVar16 != (int)lVar14);
            }
            if (uVar22 - iVar16 != 0) {
              lVar14 = 0;
              pOVar9 = pOVar21;
              do {
                *pOVar9 = *(OPJ_INT32 *)((long)ptr + lVar14 * 8 + (4 - uVar26));
                lVar14 = lVar14 + 1;
                pOVar9 = pOVar9 + (iVar11 - lVar25);
              } while (((iVar23 + iVar6) - uVar20) - iVar7 != (int)lVar14);
            }
            uVar10 = uVar10 + 1;
            pOVar24 = pOVar24 + 1;
            pOVar21 = pOVar21 + 1;
          } while (uVar10 != uVar12);
        }
        if (0 < (int)uVar22) {
          iVar23 = iVar4 - iVar5;
          uVar26 = (ulong)((uVar15 & 1) * 4);
          pOVar24 = pOVar8 + iVar23;
          uVar10 = 0;
          pOVar21 = pOVar8;
          do {
            if (0 < (int)uVar12) {
              uVar13 = 0;
              do {
                ptr[uVar13] = pOVar21[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar12 != uVar13);
            }
            (*p_function)(ptr,uVar12 - iVar23,iVar23,uVar15 & 1);
            if (0 < iVar23) {
              lVar14 = 0;
              do {
                pOVar21[lVar14] = *(OPJ_INT32 *)((long)ptr + lVar14 * 8 + uVar26);
                lVar14 = lVar14 + 1;
              } while (iVar23 != (int)lVar14);
            }
            if (0 < (int)(uVar12 - iVar23)) {
              lVar14 = 0;
              do {
                pOVar24[lVar14] = *(OPJ_INT32 *)((long)ptr + lVar14 * 8 + (4 - uVar26));
                lVar14 = lVar14 + 1;
              } while (((iVar3 + iVar5) - uVar15) - iVar4 != (int)lVar14);
            }
            uVar10 = uVar10 + 1;
            pOVar21 = pOVar21 + (iVar11 - lVar25);
            pOVar24 = pOVar24 + (iVar11 - lVar25);
          } while (uVar10 != uVar22);
        }
        poVar17 = poVar17 + -1;
        bVar27 = iVar18 != 0;
        iVar18 = iVar18 + -1;
      } while (bVar27);
    }
    opj_free(ptr);
    OVar19 = 1;
  }
  return OVar19;
}

Assistant:

static INLINE OPJ_BOOL opj_dwt_encode_procedure(opj_tcd_tilecomp_t * tilec,
        void (*p_function)(OPJ_INT32 *, OPJ_INT32, OPJ_INT32, OPJ_INT32))
{
    OPJ_INT32 i, j, k;
    OPJ_INT32 *a = 00;
    OPJ_INT32 *aj = 00;
    OPJ_INT32 *bj = 00;
    OPJ_INT32 w, l;

    OPJ_INT32 rw;           /* width of the resolution level computed   */
    OPJ_INT32 rh;           /* height of the resolution level computed  */
    OPJ_SIZE_T l_data_size;

    opj_tcd_resolution_t * l_cur_res = 0;
    opj_tcd_resolution_t * l_last_res = 0;

    w = tilec->x1 - tilec->x0;
    l = (OPJ_INT32)tilec->numresolutions - 1;
    a = tilec->data;

    l_cur_res = tilec->resolutions + l;
    l_last_res = l_cur_res - 1;

    l_data_size = opj_dwt_max_resolution(tilec->resolutions, tilec->numresolutions);
    /* overflow check */
    if (l_data_size > (SIZE_MAX / sizeof(OPJ_INT32))) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    l_data_size *= sizeof(OPJ_INT32);
    bj = (OPJ_INT32*)opj_malloc(l_data_size);
    /* l_data_size is equal to 0 when numresolutions == 1 but bj is not used */
    /* in that case, so do not error out */
    if (l_data_size != 0 && ! bj) {
        return OPJ_FALSE;
    }
    i = l;

    while (i--) {
        OPJ_INT32 rw1;      /* width of the resolution level once lower than computed one                                       */
        OPJ_INT32 rh1;      /* height of the resolution level once lower than computed one                                      */
        OPJ_INT32 cas_col;  /* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
        OPJ_INT32 cas_row;  /* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
        OPJ_INT32 dn, sn;

        rw  = l_cur_res->x1 - l_cur_res->x0;
        rh  = l_cur_res->y1 - l_cur_res->y0;
        rw1 = l_last_res->x1 - l_last_res->x0;
        rh1 = l_last_res->y1 - l_last_res->y0;

        cas_row = l_cur_res->x0 & 1;
        cas_col = l_cur_res->y0 & 1;

        sn = rh1;
        dn = rh - rh1;
        for (j = 0; j < rw; ++j) {
            aj = a + j;
            for (k = 0; k < rh; ++k) {
                bj[k] = aj[k * w];
            }

            (*p_function)(bj, dn, sn, cas_col);

            opj_dwt_deinterleave_v(bj, aj, dn, sn, w, cas_col);
        }

        sn = rw1;
        dn = rw - rw1;

        for (j = 0; j < rh; j++) {
            aj = a + j * w;
            for (k = 0; k < rw; k++) {
                bj[k] = aj[k];
            }
            (*p_function)(bj, dn, sn, cas_row);
            opj_dwt_deinterleave_h(bj, aj, dn, sn, cas_row);
        }

        l_cur_res = l_last_res;

        --l_last_res;
    }

    opj_free(bj);
    return OPJ_TRUE;
}